

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

int Am_Height_Of_Parts_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_30;
  Am_Object comp;
  Am_Value_List components;
  int comp_bottom;
  int max_y;
  Am_Object *self_local;
  
  components.item._4_4_ = 0;
  Am_Value_List::Am_Value_List((Am_Value_List *)&comp);
  Am_Object::Am_Object(&local_30);
  pAVar4 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)&comp,pAVar4);
  Am_Value_List::Start((Am_Value_List *)&comp);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)&comp), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar4 = Am_Value_List::Get((Am_Value_List *)&comp);
    Am_Object::operator=(&local_30,pAVar4);
    pAVar4 = Am_Object::Get(&local_30,0x69,0);
    bVar1 = Am_Value::Valid(pAVar4);
    if (bVar1) {
      pAVar4 = Am_Object::Get(&local_30,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(&local_30,0x67,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      components.item._4_4_ = imax(components.item._4_4_,iVar3 + iVar2);
    }
    Am_Value_List::Next((Am_Value_List *)&comp);
  }
  pAVar4 = Am_Object::Peek(self,0xa1,4);
  bVar1 = Am_Value::Exists(pAVar4);
  if (bVar1) {
    pAVar4 = Am_Object::Get(self,0xa1,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    components.item._4_4_ = iVar3 + components.item._4_4_;
  }
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&comp);
  return components.item._4_4_;
}

Assistant:

Am_Define_Formula(int, Am_Height_Of_Parts)
{
  int max_y = 0, comp_bottom;
  Am_Value_List components;
  Am_Object comp;
  components = self.Get(Am_GRAPHICAL_PARTS);
  for (components.Start(); !components.Last(); components.Next()) {
    comp = components.Get();
    if (comp.Get(Am_VISIBLE).Valid()) {
      // compute how much of the component extends below the origin
      comp_bottom = ((int)(comp.Get(Am_TOP)) + (int)(comp.Get(Am_HEIGHT)));
      max_y = imax(max_y, comp_bottom);
    }
  }
  if (self.Peek(Am_BOTTOM_OFFSET, Am_NO_DEPENDENCY).Exists())
    max_y += (int)self.Get(Am_BOTTOM_OFFSET);
  return max_y; // always >=0 since it's initialized to 0
}